

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

void Ivy_FastMapNodeArea(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,int nLimit)

{
  Ivy_Supp_t *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Ivy_Obj_t *pObj_00;
  Ivy_Obj_t *pObj_01;
  Ivy_Supp_t *pSupp_00;
  int local_58;
  int AreaAft;
  int AreaBef;
  int RefsOld;
  int DelayOld;
  int RetValue;
  Ivy_Supp_t *pSupp;
  Ivy_Supp_t *pSupp1;
  Ivy_Supp_t *pSupp0;
  Ivy_Obj_t *pFanin1;
  Ivy_Obj_t *pFanin0;
  int nLimit_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  if (0x20 < nLimit) {
    __assert_fail("nLimit <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x1c3,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  iVar2 = Ivy_ObjIsNode(pObj);
  if (iVar2 == 0) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x1c4,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  pObj_00 = Ivy_ObjFanin0(pObj);
  pObj_01 = Ivy_ObjFanin1(pObj);
  pSupp1 = Ivy_ObjSupp(pAig,pObj_00);
  pSupp = Ivy_ObjSupp(pAig,pObj_01);
  pSupp_00 = Ivy_ObjSupp(pAig,pObj);
  if (pSupp_00->fMark != '\0') {
    __assert_fail("pSupp->fMark == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x1cc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  if (pSupp_00->nRefs == 0) {
    local_58 = Ivy_FastMapNodeAreaDerefed(pAig,pObj);
  }
  else {
    local_58 = Ivy_FastMapNodeAreaRefed(pAig,pObj);
  }
  if (pSupp_00->nRefs != 0) {
    Ivy_FastMapNodeDeref(pAig,pObj);
  }
  iVar2 = Ivy_FastMapNodeDelay(pAig,pObj);
  if (iVar2 <= pSupp_00->DelayR) {
    memcpy(Ivy_FastMapNodeArea::Store,pSupp_00 + 1,(long)pSupp_00->nSize << 2);
    Ivy_FastMapNodeArea::StoreSize = (int)pSupp_00->nSize;
    iVar3 = Ivy_ObjRefs(pObj_00);
    pIVar1 = Ivy_FastMapNodeArea::pTemp0;
    if ((2 < iVar3) && (pSupp1->Delay < pSupp_00->DelayR)) {
      pSupp1 = Ivy_FastMapNodeArea::pTemp0;
      Ivy_FastMapNodeArea::pTemp0->nSize = '\x01';
      iVar3 = Ivy_ObjFaninId0(pObj);
      pIVar1[1].nSize = (char)iVar3;
      pIVar1[1].fMark = (char)((uint)iVar3 >> 8);
      pIVar1[1].fMark2 = (char)((uint)iVar3 >> 0x10);
      pIVar1[1].fMark3 = (char)((uint)iVar3 >> 0x18);
    }
    iVar3 = Ivy_ObjRefs(pObj_01);
    pIVar1 = Ivy_FastMapNodeArea::pTemp1;
    if ((2 < iVar3) && (pSupp->Delay < pSupp_00->DelayR)) {
      pSupp = Ivy_FastMapNodeArea::pTemp1;
      Ivy_FastMapNodeArea::pTemp1->nSize = '\x01';
      iVar3 = Ivy_ObjFaninId1(pObj);
      pIVar1[1].nSize = (char)iVar3;
      pIVar1[1].fMark = (char)((uint)iVar3 >> 8);
      pIVar1[1].fMark2 = (char)((uint)iVar3 >> 0x10);
      pIVar1[1].fMark3 = (char)((uint)iVar3 >> 0x18);
    }
    if (pSupp1->nSize < pSupp->nSize) {
      RefsOld = Ivy_FastMapMerge(pSupp,pSupp1,pSupp_00,nLimit);
    }
    else {
      RefsOld = Ivy_FastMapMerge(pSupp1,pSupp,pSupp_00,nLimit);
    }
    if (RefsOld == 0) {
      pSupp_00->nSize = '\x02';
      iVar3 = Ivy_ObjFaninId0(pObj);
      pSupp_00[1].nSize = (char)iVar3;
      pSupp_00[1].fMark = (char)((uint)iVar3 >> 8);
      pSupp_00[1].fMark2 = (char)((uint)iVar3 >> 0x10);
      pSupp_00[1].fMark3 = (char)((uint)iVar3 >> 0x18);
      iVar3 = Ivy_ObjFaninId1(pObj);
      pSupp_00[1].nRefs = iVar3;
    }
    iVar3 = Ivy_FastMapNodeDelay(pAig,pObj);
    pSupp_00->Delay = (short)iVar3;
    iVar3 = pSupp_00->nRefs;
    pSupp_00->nRefs = 0;
    iVar4 = Ivy_FastMapNodeAreaDerefed(pAig,pObj);
    pSupp_00->nRefs = iVar3;
    if ((local_58 < iVar4) || (pSupp_00->DelayR < pSupp_00->Delay)) {
      pSupp_00->nSize = (char)Ivy_FastMapNodeArea::StoreSize;
      memcpy(pSupp_00 + 1,Ivy_FastMapNodeArea::Store,(long)pSupp_00->nSize << 2);
      pSupp_00->Delay = (short)iVar2;
    }
    if (pSupp_00->nRefs != 0) {
      Ivy_FastMapNodeRef(pAig,pObj);
    }
    return;
  }
  __assert_fail("DelayOld <= pSupp->DelayR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                ,0x1dc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
}

Assistant:

void Ivy_FastMapNodeArea( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, int nLimit )
{
    static int Store[32], StoreSize;
    static char Supp0[16], Supp1[16];
    static Ivy_Supp_t * pTemp0 = (Ivy_Supp_t *)Supp0;
    static Ivy_Supp_t * pTemp1 = (Ivy_Supp_t *)Supp1;
    Ivy_Obj_t * pFanin0, * pFanin1;
    Ivy_Supp_t * pSupp0, * pSupp1, * pSupp;
    int RetValue, DelayOld, RefsOld;
    int AreaBef, AreaAft;
    assert( nLimit <= 32 );
    assert( Ivy_ObjIsNode(pObj) );
    // get the fanins
    pFanin0 = Ivy_ObjFanin0(pObj);
    pFanin1 = Ivy_ObjFanin1(pObj);
    // get the supports
    pSupp0 = Ivy_ObjSupp( pAig, pFanin0 );
    pSupp1 = Ivy_ObjSupp( pAig, pFanin1 );
    pSupp  = Ivy_ObjSupp( pAig, pObj );
    assert( pSupp->fMark == 0 );

    // get the area
    if ( pSupp->nRefs == 0 )
        AreaBef = Ivy_FastMapNodeAreaDerefed( pAig, pObj );
    else
        AreaBef = Ivy_FastMapNodeAreaRefed( pAig, pObj );
//    if ( AreaBef == 1 )
//        return;

    // deref the cut if the node is refed
    if ( pSupp->nRefs != 0 )
        Ivy_FastMapNodeDeref( pAig, pObj );

    // get the old delay of the node
    DelayOld = Ivy_FastMapNodeDelay(pAig, pObj);
    assert( DelayOld <= pSupp->DelayR );
    // copy the current cut
    memcpy( Store, pSupp->pArray, sizeof(int) * pSupp->nSize );
    StoreSize = pSupp->nSize;
    // get the fanin support
    if ( Ivy_ObjRefs(pFanin0) > 2 && pSupp0->Delay < pSupp->DelayR )
//    if ( pSupp0->nRefs > 0 && pSupp0->Delay < pSupp->DelayR ) // this leads to 2% worse results
    {
        pSupp0 = pTemp0;
        pSupp0->nSize = 1;
        pSupp0->pArray[0] = Ivy_ObjFaninId0(pObj);
    }
    // get the fanin support
    if ( Ivy_ObjRefs(pFanin1) > 2 && pSupp1->Delay < pSupp->DelayR )
//    if ( pSupp1->nRefs > 0 && pSupp1->Delay < pSupp->DelayR )
    {
        pSupp1 = pTemp1;
        pSupp1->nSize = 1;
        pSupp1->pArray[0] = Ivy_ObjFaninId1(pObj);
    }
    // merge the cuts
    if ( pSupp0->nSize < pSupp1->nSize )
        RetValue = Ivy_FastMapMerge( pSupp1, pSupp0, pSupp, nLimit );
    else
        RetValue = Ivy_FastMapMerge( pSupp0, pSupp1, pSupp, nLimit );
    if ( !RetValue )
    {
        pSupp->nSize = 2;
        pSupp->pArray[0] = Ivy_ObjFaninId0(pObj);
        pSupp->pArray[1] = Ivy_ObjFaninId1(pObj);
    }

    // check the resulting delay
    pSupp->Delay = Ivy_FastMapNodeDelay(pAig, pObj);

    RefsOld = pSupp->nRefs; pSupp->nRefs = 0;
    AreaAft = Ivy_FastMapNodeAreaDerefed( pAig, pObj );
    pSupp->nRefs = RefsOld;

    if ( AreaAft > AreaBef || pSupp->Delay > pSupp->DelayR )
//    if ( pSupp->Delay > pSupp->DelayR )
    {
        pSupp->nSize = StoreSize;
        memcpy( pSupp->pArray, Store, sizeof(int) * pSupp->nSize );
        pSupp->Delay = DelayOld;
//        printf( "-" );
    }
//    else
//        printf( "+" );

    if ( pSupp->nRefs != 0 )
        Ivy_FastMapNodeRef( pAig, pObj );
}